

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  OutPt *pOVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  lVar1 = (btmPt1->Pt).X;
  lVar2 = (btmPt1->Pt).Y;
  pOVar6 = btmPt1;
  do {
    pOVar6 = pOVar6->Prev;
    lVar3 = (pOVar6->Pt).X;
    lVar5 = (pOVar6->Pt).Y;
    if ((pOVar6 == btmPt1) || (lVar3 != lVar1)) break;
  } while (lVar5 == lVar2);
  lVar5 = lVar5 - lVar2;
  pOVar6 = btmPt1;
  if (lVar5 == 0) {
    dVar7 = -1e+40;
  }
  else {
    dVar7 = (double)(lVar3 - lVar1) / (double)lVar5;
  }
  do {
    pOVar6 = pOVar6->Next;
    lVar3 = (pOVar6->Pt).X;
    lVar5 = (pOVar6->Pt).Y;
    if ((pOVar6 == btmPt1) || (lVar3 != lVar1)) break;
  } while (lVar5 == lVar2);
  dVar7 = ABS(dVar7);
  lVar5 = lVar5 - lVar2;
  if (lVar5 == 0) {
    dVar8 = -1e+40;
  }
  else {
    dVar8 = (double)(lVar3 - lVar1) / (double)lVar5;
  }
  lVar1 = (btmPt2->Pt).X;
  lVar2 = (btmPt2->Pt).Y;
  pOVar6 = btmPt2;
  do {
    pOVar6 = pOVar6->Prev;
    lVar3 = (pOVar6->Pt).X;
    lVar5 = (pOVar6->Pt).Y;
    if ((pOVar6 == btmPt2) || (lVar3 != lVar1)) break;
  } while (lVar5 == lVar2);
  dVar8 = ABS(dVar8);
  lVar5 = lVar5 - lVar2;
  pOVar6 = btmPt2;
  if (lVar5 == 0) {
    dVar9 = -1e+40;
  }
  else {
    dVar9 = (double)(lVar3 - lVar1) / (double)lVar5;
  }
  do {
    pOVar6 = pOVar6->Next;
    lVar3 = (pOVar6->Pt).X;
    lVar5 = (pOVar6->Pt).Y;
    if ((pOVar6 == btmPt2) || (lVar3 != lVar1)) break;
  } while (lVar5 == lVar2);
  dVar9 = ABS(dVar9);
  lVar5 = lVar5 - lVar2;
  if (lVar5 == 0) {
    dVar10 = -1e+40;
  }
  else {
    dVar10 = (double)(lVar3 - lVar1) / (double)lVar5;
  }
  dVar10 = ABS(dVar10);
  dVar11 = dVar8;
  if (dVar8 <= dVar7) {
    dVar11 = dVar7;
  }
  dVar12 = dVar10;
  if (dVar10 <= dVar9) {
    dVar12 = dVar9;
  }
  if ((dVar11 == dVar12) && (!NAN(dVar11) && !NAN(dVar12))) {
    dVar11 = dVar8;
    if (dVar7 <= dVar8) {
      dVar11 = dVar7;
    }
    dVar12 = dVar10;
    if (dVar9 <= dVar10) {
      dVar12 = dVar9;
    }
    if ((dVar11 == dVar12) && (!NAN(dVar11) && !NAN(dVar12))) {
      dVar7 = Area(btmPt1);
      bVar4 = 0.0 < dVar7;
      goto LAB_002794aa;
    }
  }
  if ((dVar7 < dVar9) || (bVar4 = 1, dVar7 < dVar10)) {
    bVar4 = -(dVar9 <= dVar8) & -(dVar10 <= dVar8);
  }
LAB_002794aa:
  return (bool)(bVar4 & 1);
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->Prev;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Prev;
  double dx1p = std::fabs(GetDx(btmPt1->Pt, p->Pt));
  p = btmPt1->Next;
  while ((p->Pt == btmPt1->Pt) && (p != btmPt1)) p = p->Next;
  double dx1n = std::fabs(GetDx(btmPt1->Pt, p->Pt));

  p = btmPt2->Prev;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Prev;
  double dx2p = std::fabs(GetDx(btmPt2->Pt, p->Pt));
  p = btmPt2->Next;
  while ((p->Pt == btmPt2->Pt) && (p != btmPt2)) p = p->Next;
  double dx2n = std::fabs(GetDx(btmPt2->Pt, p->Pt));

  if (std::max(dx1p, dx1n) == std::max(dx2p, dx2n) &&
    std::min(dx1p, dx1n) == std::min(dx2p, dx2n))
      return Area(btmPt1) > 0; //if otherwise identical use orientation
  else
    return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}